

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LoopFissionImpl::TraverseUseDef
          (LoopFissionImpl *this,Instruction *inst,
          set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *returned_set,bool ignore_phi_users,bool report_loads)

{
  DefUseManager *pDVar1;
  anon_class_40_6_33883d21 local_80;
  undefined1 local_58 [8];
  function<void_(spvtools::opt::Instruction_*)> traverser_functor;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *inst_set;
  DefUseManager *def_use;
  bool report_loads_local;
  bool ignore_phi_users_local;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *returned_set_local;
  Instruction *inst_local;
  LoopFissionImpl *this_local;
  
  if (returned_set ==
      (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       *)0x0) {
    __assert_fail("returned_set && \"Set to be returned cannot be null.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fission.cpp"
                  ,0x7a,
                  "void spvtools::opt::LoopFissionImpl::TraverseUseDef(Instruction *, std::set<Instruction *> *, bool, bool)"
                 );
  }
  pDVar1 = IRContext::get_def_use_mgr(this->context_);
  traverser_functor._M_invoker = (_Invoker_type)returned_set;
  std::function<void_(spvtools::opt::Instruction_*)>::function
            ((function<void_(spvtools::opt::Instruction_*)> *)local_58);
  local_80.inst_set =
       (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        *)traverser_functor._M_invoker;
  local_80.traverser_functor = (function<void_(spvtools::opt::Instruction_*)> *)local_58;
  local_80.this = this;
  local_80.def_use = pDVar1;
  local_80.ignore_phi_users = ignore_phi_users;
  local_80.report_loads = report_loads;
  std::function<void(spvtools::opt::Instruction*)>::operator=
            ((function<void(spvtools::opt::Instruction*)> *)local_58,&local_80);
  std::function<void_(spvtools::opt::Instruction_*)>::operator()
            ((function<void_(spvtools::opt::Instruction_*)> *)local_58,inst);
  std::function<void_(spvtools::opt::Instruction_*)>::~function
            ((function<void_(spvtools::opt::Instruction_*)> *)local_58);
  return;
}

Assistant:

void LoopFissionImpl::TraverseUseDef(Instruction* inst,
                                     std::set<Instruction*>* returned_set,
                                     bool ignore_phi_users, bool report_loads) {
  assert(returned_set && "Set to be returned cannot be null.");

  analysis::DefUseManager* def_use = context_->get_def_use_mgr();
  std::set<Instruction*>& inst_set = *returned_set;

  // We create this functor to traverse the use def chain to build the
  // grouping of related instructions. The lambda captures the std::function
  // to allow it to recurse.
  std::function<void(Instruction*)> traverser_functor;
  traverser_functor = [this, def_use, &inst_set, &traverser_functor,
                       ignore_phi_users, report_loads](Instruction* user) {
    // If we've seen the instruction before or it is not inside the loop end the
    // traversal.
    if (!user || seen_instructions_.count(user) != 0 ||
        !context_->get_instr_block(user) ||
        !loop_->IsInsideLoop(context_->get_instr_block(user))) {
      return;
    }

    // Don't include labels or loop merge instructions in the instruction sets.
    // Including them would mean we group instructions related only by using the
    // same labels (i.e phis). We already preempt the inclusion of
    // OpSelectionMerge by adding related instructions to the seen_instructions_
    // set.
    if (user->opcode() == spv::Op::OpLoopMerge ||
        user->opcode() == spv::Op::OpLabel)
      return;

    // If the |report_loads| flag is set, set the class field
    // load_used_in_condition_ to false. This is used to check that none of the
    // condition checks in the loop rely on loads.
    if (user->opcode() == spv::Op::OpLoad && report_loads) {
      load_used_in_condition_ = true;
    }

    // Add the instruction to the set of instructions already seen, this breaks
    // recursion and allows us to ignore certain instructions.
    seen_instructions_.insert(user);

    inst_set.insert(user);

    // Wrapper functor to traverse the operands of each instruction.
    auto traverse_operand = [&traverser_functor, def_use](const uint32_t* id) {
      traverser_functor(def_use->GetDef(*id));
    };
    user->ForEachInOperand(traverse_operand);

    // For the first traversal we want to ignore the users of the phi.
    if (ignore_phi_users && user->opcode() == spv::Op::OpPhi) return;

    // Traverse each user with this lambda.
    def_use->ForEachUser(user, traverser_functor);

    // Wrapper functor for the use traversal.
    auto traverse_use = [&traverser_functor](Instruction* use, uint32_t) {
      traverser_functor(use);
    };
    def_use->ForEachUse(user, traverse_use);

  };

  // We start the traversal of the use def graph by invoking the above
  // lambda with the |inst| parameter.
  traverser_functor(inst);
}